

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

void __thiscall QCompleter::complete(QCompleter *this,QRect *rect)

{
  long lVar1;
  undefined8 uVar2;
  QModelIndex index;
  bool bVar3;
  int iVar4;
  QCompleterPrivate *this_00;
  undefined8 *in_RSI;
  QCompleterPrivate *in_RDI;
  long in_FS_OFFSET;
  QModelIndex in_stack_00000010;
  QCompleterPrivate *d;
  QModelIndex idx;
  QModelIndex *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff68;
  undefined1 sourceIndex;
  QCompletionModel *pQVar5;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  bool select;
  QRect *in_stack_ffffffffffffffb0;
  QCompleterPrivate *in_stack_ffffffffffffffb8;
  totally_ordered_wrapper<const_QAbstractItemModel_*> in_stack_ffffffffffffffc0;
  
  sourceIndex = (undefined1)((ulong)in_stack_ffffffffffffff68 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QCompleter *)0xa6ddf5);
  QCompletionModel::currentIndex
            ((QCompletionModel *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
             (bool)sourceIndex);
  this_00->hiddenBecauseNoMatch = false;
  if (this_00->mode == InlineCompletion) {
    bVar3 = QModelIndex::isValid(in_stack_ffffffffffffff50);
    if (bVar3) {
      QCompleterPrivate::_q_complete
                ((QCompleterPrivate *)
                 CONCAT17(in_stack_ffffffffffffff77,
                          CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
                 in_stack_00000010,(bool)sourceIndex);
    }
    goto LAB_00a6e021;
  }
  if (this_00->mode == PopupCompletion) {
    bVar3 = QModelIndex::isValid(in_stack_ffffffffffffff50);
    select = true;
    if (bVar3) goto LAB_00a6defe;
  }
  else {
LAB_00a6defe:
    select = false;
    if (this_00->mode == UnfilteredPopupCompletion) {
      pQVar5 = this_00->proxy;
      QModelIndex::QModelIndex((QModelIndex *)0xa6df2d);
      iVar4 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,&stack0xffffffffffffffb0);
      select = iVar4 == 0;
    }
  }
  if (select == false) {
    popup((QCompleter *)this_00);
    if (this_00->mode == UnfilteredPopupCompletion) {
      index.i = (quintptr)in_stack_ffffffffffffffb8;
      index._0_8_ = in_stack_ffffffffffffffb0;
      index.m.ptr = in_stack_ffffffffffffffc0.ptr;
      QCompleterPrivate::setCurrentIndex(in_RDI,index,select);
    }
    QCompleterPrivate::showPopup(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    uVar2 = *in_RSI;
    (this_00->popupRect).x1 = (Representation)(int)uVar2;
    (this_00->popupRect).y1 = (Representation)(int)((ulong)uVar2 >> 0x20);
    uVar2 = in_RSI[1];
    (this_00->popupRect).x2 = (Representation)(int)uVar2;
    (this_00->popupRect).y2 = (Representation)(int)((ulong)uVar2 >> 0x20);
  }
  else {
    if (this_00->popup != (QAbstractItemView *)0x0) {
      QWidget::hide((QWidget *)0xa6df79);
    }
    this_00->hiddenBecauseNoMatch = true;
  }
LAB_00a6e021:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCompleter::complete(const QRect& rect)
{
    Q_D(QCompleter);
    QModelIndex idx = d->proxy->currentIndex(false);
    d->hiddenBecauseNoMatch = false;
    if (d->mode == QCompleter::InlineCompletion) {
        if (idx.isValid())
            d->_q_complete(idx, true);
        return;
    }

    Q_ASSERT(d->widget);
    if ((d->mode == QCompleter::PopupCompletion && !idx.isValid())
        || (d->mode == QCompleter::UnfilteredPopupCompletion && d->proxy->rowCount() == 0)) {
        if (d->popup)
            d->popup->hide(); // no suggestion, hide
        d->hiddenBecauseNoMatch = true;
        return;
    }

    popup();
    if (d->mode == QCompleter::UnfilteredPopupCompletion)
        d->setCurrentIndex(idx, false);

    d->showPopup(rect);
    d->popupRect = rect;
}